

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

void overlap_remove(bam_plp_t iter,bam1_t *b)

{
  khint_t kVar1;
  uint uVar2;
  olap_hash_t *poVar3;
  uint8_t *__s2;
  khint32_t *pkVar4;
  uint8_t uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  uint8_t *puVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  poVar3 = iter->overlaps;
  if (poVar3 != (olap_hash_t *)0x0) {
    if (b == (bam1_t *)0x0) {
      if (poVar3->n_buckets != 0) {
        pkVar4 = poVar3->flags;
        uVar6 = 0;
        uVar10 = 0;
        do {
          uVar12 = pkVar4[uVar10 >> 4];
          if ((uVar12 >> (sbyte)(uVar6 & 0x1e) & 3) == 0) {
            pkVar4[uVar10 >> 4] = uVar12 | 1 << (uVar6 & 0x1e);
            poVar3->size = poVar3->size - 1;
          }
          uVar10 = uVar10 + 1;
          uVar6 = uVar6 + 2;
        } while (uVar10 < poVar3->n_buckets);
      }
    }
    else {
      kVar1 = poVar3->n_buckets;
      if (kVar1 == 0) {
        uVar6 = 0;
      }
      else {
        __s2 = b->data;
        uVar10 = (uint)(char)*__s2;
        if (*__s2 == '\0') {
          uVar10 = 0;
        }
        else {
          uVar5 = __s2[1];
          if (uVar5 != '\0') {
            puVar9 = __s2 + 2;
            do {
              uVar10 = (int)(char)uVar5 + uVar10 * 0x1f;
              uVar5 = *puVar9;
              puVar9 = puVar9 + 1;
            } while (uVar5 != '\0');
          }
        }
        uVar10 = uVar10 & kVar1 - 1;
        pkVar4 = poVar3->flags;
        iVar11 = 1;
        uVar12 = uVar10;
        do {
          uVar2 = pkVar4[uVar12 >> 4];
          bVar8 = (char)uVar12 * '\x02' & 0x1e;
          uVar6 = uVar2 >> bVar8;
          if (((uVar6 & 2) != 0) ||
             (((uVar6 & 1) == 0 && (iVar7 = strcmp(poVar3->keys[uVar12],(char *)__s2), iVar7 == 0)))
             ) {
            uVar6 = uVar12;
            if ((uVar2 >> bVar8 & 3) != 0) {
              uVar6 = kVar1;
            }
            break;
          }
          uVar12 = uVar12 + iVar11 & kVar1 - 1;
          iVar11 = iVar11 + 1;
          uVar6 = kVar1;
        } while (uVar12 != uVar10);
      }
      if (uVar6 != kVar1) {
        uVar10 = poVar3->flags[uVar6 >> 4];
        uVar12 = uVar6 * 2 & 0x1e;
        if ((uVar10 >> (sbyte)uVar12 & 3) == 0) {
          poVar3->flags[uVar6 >> 4] = uVar10 | 1 << uVar12;
          poVar3->size = poVar3->size - 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void overlap_remove(bam_plp_t iter, const bam1_t *b)
{
    if ( !iter->overlaps ) return;

    khiter_t kitr;
    if ( b )
    {
        kitr = kh_get(olap_hash, iter->overlaps, bam_get_qname(b));
        if ( kitr!=kh_end(iter->overlaps) )
            kh_del(olap_hash, iter->overlaps, kitr);
    }
    else
    {
        // remove all
        for (kitr = kh_begin(iter->overlaps); kitr<kh_end(iter->overlaps); kitr++)
            if ( kh_exist(iter->overlaps, kitr) ) kh_del(olap_hash, iter->overlaps, kitr);
    }
}